

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assessment_1.cpp
# Opt level: O2

void read_cmd_tokens(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *tokens)

{
  token_code tVar1;
  long lVar2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  float p;
  float fVar3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_88;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_70;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_58;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_40;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_28;
  
  tVar1 = get_token_code((tokens->
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start);
  switch(tVar1) {
  case ambient:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_28,tokens);
    record_token_rgb(ca,&local_28);
    this = &local_28;
    goto LAB_0010b9af;
  case diffuse:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_40,tokens);
    record_token_rgb(cr,&local_40);
    this = &local_40;
    goto LAB_0010b9af;
  case specular:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_58,tokens);
    record_token_rgb(cp,&local_58);
    this = &local_58;
    goto LAB_0010b9af;
  case set_pu:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    fVar3 = std::__cxx11::stof((tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
    pu = 1.0 / fVar3;
    break;
  case set_pv:
    using_phong = false;
    using_WARD = true;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    fVar3 = std::__cxx11::stof((tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
    pv = 1.0 / fVar3;
    break;
  case set_p:
    using_phong = true;
    using_WARD = false;
    using_toon = false;
    using_translucent = false;
    using_sketch = false;
    ::p = std::__cxx11::stoi((tokens->
                             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0,10);
    break;
  case add_dl:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_70,tokens);
    record_token_light(dls,dl_cs,&local_70);
    this = &local_70;
    goto LAB_0010b9af;
  case add_pl:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_88,tokens);
    record_token_light(pls,pl_cs,&local_88);
    this = &local_88;
LAB_0010b9af:
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(this);
    break;
  case toon:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(&local_a0,tokens);
    record_token_rgb(cc1,&local_a0);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a0);
    cc2[0] = std::__cxx11::stof((tokens->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 4,(size_t *)0x0);
    cc2[1] = std::__cxx11::stof((tokens->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 5,(size_t *)0x0);
    cc2[2] = std::__cxx11::stof((tokens->
                                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                )._M_impl.super__Vector_impl_data._M_start + 6,(size_t *)0x0);
    break;
  case set_toon_layers:
    using_phong = true;
    using_WARD = false;
    using_toon = true;
    using_translucent = false;
    using_sketch = false;
    toonl = std::__cxx11::stof((tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
    break;
  case set_depth:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    depth = std::__cxx11::stof((tokens->
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
    break;
  case set_dd:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    dd = std::__cxx11::stof((tokens->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
    break;
  case set_ds:
    using_translucent = true;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    using_sketch = false;
    ds = std::__cxx11::stof((tokens->
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start + 1,(size_t *)0x0);
    break;
  case set_sketch:
    using_sketch = true;
    using_translucent = false;
    using_phong = false;
    using_WARD = false;
    using_toon = false;
    fVar3 = 0.0;
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
      fVar3 = fVar3 + *(float *)((long)line_dir + lVar2) * *(float *)((long)line_dir + lVar2);
    }
    if (fVar3 < 0.0) {
      fVar3 = sqrtf(fVar3);
    }
    else {
      fVar3 = SQRT(fVar3);
    }
    for (lVar2 = 0; lVar2 != 8; lVar2 = lVar2 + 4) {
      *(float *)((long)line_dir + lVar2) = *(float *)((long)line_dir + lVar2) * (1.0 / fVar3);
    }
  }
  return;
}

Assistant:

void read_cmd_tokens(const vector<string> tokens){

    switch (get_token_code(tokens[0])) {
        case ambient:
            record_token_rgb(ca, tokens);
            break;

        case diffuse:
            record_token_rgb(cr, tokens);
            break;
        
        case specular:
            record_token_rgb(cp, tokens);
            break;

        case set_pu:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pu = 1.0f/stof(tokens[1]);
            break;
        
        case set_pv:
            using_phong = false;
            using_WARD = true;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            pv = 1.0f/stof(tokens[1]);
            break;
        
        case set_p:
            using_phong = true;
            using_WARD = false;
            using_toon = false;
            using_translucent = false;
            using_sketch = false;
            p = stoi(tokens[1]);
            break;

        case add_dl:
            record_token_light(dls, dl_cs, tokens);
            break;

        case add_pl:
            record_token_light(pls, pl_cs, tokens);
            break;

        case toon:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            record_token_rgb(cc1, tokens);
            cc2[0] = stof(tokens[4]);
            cc2[1] = stof(tokens[5]);
            cc2[2] = stof(tokens[6]);
            break;

        case set_toon_layers:
            using_phong = true;
            using_WARD = false;
            using_toon = true;
            using_translucent = false;
            using_sketch = false;
            toonl = stof(tokens[1]);
            break;

        case set_depth:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            depth = stof(tokens[1]);
            break;

        case set_dd:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            dd = stof(tokens[1]);
            break;

        case set_ds:
            using_translucent = true;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            using_sketch = false;
            ds = stof(tokens[1]);
            break;

        case set_sketch:
            using_sketch = true;
            using_translucent = false;
            using_phong = false;
            using_WARD = false;
            using_toon = false;
            vec2_norm(line_dir, line_dir); //normalize line direction for sketch
            break;

        default:
            break;
    }

}